

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O1

void slide_hash(deflate_state *s)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ushort *puVar4;
  ushort uVar5;
  
  uVar1 = s->w_size;
  uVar3 = (ulong)s->hash_size;
  puVar4 = s->head + uVar3;
  do {
    puVar4 = puVar4 + -1;
    uVar5 = *puVar4 - (short)uVar1;
    if (*puVar4 < uVar1) {
      uVar5 = 0;
    }
    *puVar4 = uVar5;
    uVar2 = (int)uVar3 - 1;
    uVar3 = (ulong)uVar2;
  } while (uVar2 != 0);
  puVar4 = s->prev + uVar1;
  uVar2 = uVar1;
  do {
    puVar4 = puVar4 + -1;
    uVar5 = *puVar4 - (short)uVar1;
    if (*puVar4 < uVar1) {
      uVar5 = 0;
    }
    *puVar4 = uVar5;
    uVar2 = uVar2 - 1;
  } while (uVar2 != 0);
  return;
}

Assistant:

local void slide_hash(s)
    deflate_state *s;
{
    unsigned n, m;
    Posf *p;
    uInt wsize = s->w_size;

    n = s->hash_size;
    p = &s->head[n];
    do {
        m = *--p;
        *p = (Pos)(m >= wsize ? m - wsize : NIL);
    } while (--n);
    n = wsize;
#ifndef FASTEST
    p = &s->prev[n];
    do {
        m = *--p;
        *p = (Pos)(m >= wsize ? m - wsize : NIL);
        /* If n is not on any hash chain, prev[n] is garbage but
         * its value will never be used.
         */
    } while (--n);
#endif
}